

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O3

TilePipelineStateCreateInfoX * __thiscall
Diligent::TilePipelineStateCreateInfoX::Clear(TilePipelineStateCreateInfoX *this)

{
  TilePipelineStateCreateInfoX CleanDesc;
  TilePipelineStateCreateInfoX local_1a0;
  
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.StringPool._M_h._M_buckets =
       &local_1a0.
        super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
        .ResourceLayout.StringPool._M_h._M_single_bucket;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.super_DeviceObjectAttribs
  .Name = (Char *)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.SRBAllocationGranularity
       = 1;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.ImmediateContextMask = 1;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  DefaultVariableType = SHADER_RESOURCE_VARIABLE_TYPE_STATIC;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  DefaultVariableMergeStages = SHADER_TYPE_UNKNOWN;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  NumVariables = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.Variables
       = (ShaderResourceVariableDesc *)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  NumImmutableSamplers = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.ResourceLayout.
  ImmutableSamplers = (ImmutableSamplerDesc *)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.Flags = PSO_CREATE_FLAG_NONE;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.ResourceSignaturesCount = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.ppResourceSignatures =
       (IPipelineResourceSignature **)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.pPSOCache._0_1_ = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.pPSOCache._1_7_ = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.pInternalData._0_1_ = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo._89_8_ = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.TilePipeline.SampleCount = '\x01';
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.TilePipeline.RTVFormats[0] = TEX_FORMAT_UNKNOWN;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.TilePipeline.RTVFormats[1] = TEX_FORMAT_UNKNOWN;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.TilePipeline.RTVFormats[2] = TEX_FORMAT_UNKNOWN;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.TilePipeline.RTVFormats[3] = TEX_FORMAT_UNKNOWN;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.TilePipeline.RTVFormats[4] = TEX_FORMAT_UNKNOWN;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.TilePipeline.RTVFormats[5] = TEX_FORMAT_UNKNOWN;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.TilePipeline.RTVFormats[6] = TEX_FORMAT_UNKNOWN;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.TilePipeline.RTVFormats[7] = TEX_FORMAT_UNKNOWN;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.pTS = (IShader *)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .super_TilePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.PipelineType =
       PIPELINE_TYPE_LAST;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.super_PipelineResourceLayoutDesc.DefaultVariableType =
       SHADER_RESOURCE_VARIABLE_TYPE_STATIC;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.super_PipelineResourceLayoutDesc.DefaultVariableMergeStages = SHADER_TYPE_UNKNOWN;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.super_PipelineResourceLayoutDesc.NumVariables = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.super_PipelineResourceLayoutDesc.Variables = (ShaderResourceVariableDesc *)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.super_PipelineResourceLayoutDesc.NumImmutableSamplers = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.ImtblSamCopy.
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.ImtblSamCopy.
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.ImtblSamCopy.
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.VarCopy.
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.VarCopy.
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.super_PipelineResourceLayoutDesc.ImmutableSamplers = (ImmutableSamplerDesc *)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.VarCopy.
  super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.StringPool._M_h._M_bucket_count = 1;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.StringPool._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.StringPool._M_h._M_element_count = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.StringPool._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.StringPool._M_h._M_rehash_policy._M_next_resize = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .ResourceLayout.StringPool._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .StringPool._M_h._M_buckets =
       &local_1a0.
        super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
        .StringPool._M_h._M_single_bucket;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .StringPool._M_h._M_bucket_count = 1;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .StringPool._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .StringPool._M_h._M_element_count = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .StringPool._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .StringPool._M_h._M_rehash_policy._M_next_resize = 0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .StringPool._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .Objects.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .Objects.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .Objects.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .Signatures.
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .Signatures.
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .Signatures.
  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .InternalData._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  std::swap<Diligent::TilePipelineStateCreateInfoX>(this,&local_1a0);
  if ((_Head_base<0UL,_unsigned_char_*,_false>)
      local_1a0.
      super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
      .InternalData._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
      ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
    operator_delete__((void *)local_1a0.
                              super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                              .InternalData._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  local_1a0.
  super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
  .InternalData._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
  if (local_1a0.
      super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
      .Signatures.
      super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.
                    super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                    .Signatures.
                    super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.
                          super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                          .Signatures.
                          super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.
                          super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                          .Signatures.
                          super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ::~vector(&local_1a0.
             super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
             .Objects);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1a0.
                 super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                 .StringPool._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1a0.
                 super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                 .ResourceLayout.StringPool._M_h);
  if (local_1a0.
      super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
      .ResourceLayout.ImtblSamCopy.
      super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.
                    super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                    .ResourceLayout.ImtblSamCopy.
                    super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.
                          super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                          .ResourceLayout.ImtblSamCopy.
                          super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.
                          super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                          .ResourceLayout.ImtblSamCopy.
                          super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a0.
      super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
      .ResourceLayout.VarCopy.
      super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.
                    super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                    .ResourceLayout.VarCopy.
                    super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.
                          super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                          .ResourceLayout.VarCopy.
                          super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.
                          super_PipelineStateCreateInfoX<Diligent::TilePipelineStateCreateInfoX,_Diligent::TilePipelineStateCreateInfo>
                          .ResourceLayout.VarCopy.
                          super__Vector_base<Diligent::ShaderResourceVariableDesc,_std::allocator<Diligent::ShaderResourceVariableDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

TilePipelineStateCreateInfoX& Clear()
    {
        TilePipelineStateCreateInfoX CleanDesc;
        std::swap(*this, CleanDesc);
        return *this;
    }